

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

bool EOPlus::ctype_ident(char c)

{
  bool bVar1;
  undefined1 local_b;
  undefined1 local_a;
  char c_local;
  
  local_a = false;
  if (c != '$') {
    bVar1 = ctype_ident_start(c);
    local_b = true;
    if (!bVar1) {
      local_b = ctype_digit(c);
    }
    local_a = local_b;
  }
  return local_a;
}

Assistant:

bool ctype_ident(char c) { return c != '$' && (ctype_ident_start(c) || ctype_digit(c)); }